

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thrdd.c
# Opt level: O1

void async_thrdd_destroy(Curl_easy *data)

{
  curl_socket_t s;
  int iVar1;
  async_thrdd_addr_ctx *addr_ctx;
  curl_trc_feat *pcVar2;
  
  addr_ctx = (data->state).async.thrdd.addr;
  if (addr_ctx != (async_thrdd_addr_ctx *)0x0) {
    s = addr_ctx->sock_pair[0];
    pthread_mutex_lock((pthread_mutex_t *)&addr_ctx->mutx);
    (data->state).async.thrdd.addr = (async_thrdd_addr_ctx *)0x0;
    addr_ctx->ref_count = addr_ctx->ref_count + -1;
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
       && (0 < Curl_trc_feat_dns.log_level)) {
      Curl_trc_dns(data,"resolve, destroy async data, shared ref=%d");
    }
    iVar1 = addr_ctx->ref_count;
    pthread_mutex_unlock((pthread_mutex_t *)&addr_ctx->mutx);
    if (iVar1 == 0) {
      if (addr_ctx->thread_hnd != (pthread_t *)0x0) {
        Curl_thread_join(&addr_ctx->thread_hnd);
      }
      addr_ctx_destroy(addr_ctx);
    }
    else {
      Curl_thread_destroy(&addr_ctx->thread_hnd);
    }
    Curl_multi_will_close(data,s);
    close(s);
    return;
  }
  return;
}

Assistant:

static void async_thrdd_destroy(struct Curl_easy *data)
{
  struct async_thrdd_ctx *thrdd = &data->state.async.thrdd;
  struct async_thrdd_addr_ctx *addr = thrdd->addr;
#ifdef USE_HTTPSRR_ARES
  if(thrdd->rr.channel) {
    ares_destroy(thrdd->rr.channel);
    thrdd->rr.channel = NULL;
  }
  Curl_httpsrr_cleanup(&thrdd->rr.hinfo);
#endif

  if(addr) {
#ifndef CURL_DISABLE_SOCKETPAIR
    curl_socket_t sock_rd = addr->sock_pair[0];
#endif
    bool done;

    /* Release our reference to the data shared with the thread. */
    Curl_mutex_acquire(&addr->mutx);
    thrdd->addr = NULL;
    --addr->ref_count;
    CURL_TRC_DNS(data, "resolve, destroy async data, shared ref=%d",
                 addr->ref_count);
    done = !addr->ref_count;
    Curl_mutex_release(&addr->mutx);

    if(!done) {
      /* thread is still running. Detach the thread, it will
       * trigger the cleanup when it releases its reference. */
      Curl_thread_destroy(&addr->thread_hnd);
    }
    else {
      /* thread has released its reference, join it and
       * release the memory we shared with it. */
      if(addr->thread_hnd != curl_thread_t_null)
        Curl_thread_join(&addr->thread_hnd);
      addr_ctx_destroy(addr);
    }
#ifndef CURL_DISABLE_SOCKETPAIR
    /*
     * ensure CURLMOPT_SOCKETFUNCTION fires CURL_POLL_REMOVE
     * before the FD is invalidated to avoid EBADF on EPOLL_CTL_DEL
     */
    Curl_multi_will_close(data, sock_rd);
    wakeup_close(sock_rd);
#endif
  }
}